

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

QString * __thiscall
QtMWidgets::PickerPrivate::itemText
          (QString *__return_storage_ptr__,PickerPrivate *this,QModelIndex *index)

{
  bool bVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  QVariant local_40;
  QModelIndex *local_20;
  QModelIndex *index_local;
  PickerPrivate *this_local;
  
  local_20 = index;
  index_local = (QModelIndex *)this;
  this_local = (PickerPrivate *)__return_storage_ptr__;
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    (**(code **)(*(long *)this->model + 0x90))
              (&local_40,this->model,local_20,0,in_R8,in_R9,&local_40);
    QVariant::toString();
    QVariant::~QVariant(&local_40);
  }
  else {
    QString::QString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString
PickerPrivate::itemText( const QModelIndex & index ) const
{
	return index.isValid() ? model->data( index, Qt::DisplayRole ).toString() :
		QString();
}